

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall Assimp::MD5Importer::LoadMD5AnimFile(MD5Importer *this)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  pointer pcVar4;
  IOSystem *pIVar5;
  pointer pfVar6;
  undefined1 auVar7 [16];
  pointer *ppaVar8;
  void *__dest;
  pointer pFVar9;
  MD5Importer *this_00;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiAnimation **ppaVar11;
  aiAnimation *paVar12;
  aiNodeAnim **ppaVar13;
  aiNodeAnim *paVar14;
  aiVectorKey *paVar15;
  aiQuatKey *paVar16;
  Logger *pLVar17;
  float *pfVar18;
  pointer pAVar19;
  aiNode *paVar20;
  runtime_error *this_01;
  uint i;
  uint uVar21;
  long lVar22;
  aiQuatKey *paVar23;
  ulong uVar24;
  pointer pBVar25;
  float *pfVar26;
  float *pfVar27;
  SkeletonMeshBuilder *pSVar28;
  aiVector3D *paVar29;
  pointer pBVar30;
  pointer pFVar31;
  ulong __n;
  pointer pAVar32;
  uint uVar33;
  ulong uVar34;
  float fVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  float fVar38;
  double dVar39;
  string pFile;
  MD5AnimParser animParser;
  MD5Parser parser;
  SkeletonMeshBuilder skeleton_maker;
  float local_508;
  float local_504;
  aiAnimation *local_500;
  aiVectorKey *local_4f8;
  pointer local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  MD5AnimParser local_4c8;
  MD5Importer *local_470;
  double local_468;
  MD5Parser local_460;
  SkeletonMeshBuilder local_438 [12];
  IOStream *file;
  
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  pcVar4 = (this->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar4,pcVar4 + (this->mFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_4e8);
  pIVar5 = this->pIOHandler;
  ppaVar8 = &local_438[0].mVertices.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_438[0].mVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppaVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar10 = (*pIVar5->_vptr_IOSystem[4])
                     (pIVar5,local_4e8._M_dataplus._M_p,
                      local_438[0].mVertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  file = (IOStream *)CONCAT44(extraout_var,iVar10);
  if (local_438[0].mVertices.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppaVar8) {
    operator_delete(local_438[0].mVertices.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((file == (IOStream *)0x0) ||
     (iVar10 = (*file->_vptr_IOStream[6])(file), CONCAT44(extraout_var_00,iVar10) == 0)) {
    pLVar17 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   "Failed to read MD5ANIM file: ",&local_4e8);
    Logger::warn(pLVar17,(char *)local_438[0].mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    if (local_438[0].mVertices.
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppaVar8) {
      operator_delete(local_438[0].mVertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    LoadFileIntoMemory(this,file);
    MD5::MD5Parser::MD5Parser(&local_460,this->mBuffer,this->fileSize);
    MD5::MD5AnimParser::MD5AnimParser(&local_4c8,&local_460.mSections);
    if ((local_4c8.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_4c8.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((local_4c8.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_start ==
         local_4c8.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_finish ||
        (((long)local_4c8.mBaseFrames.
                super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4c8.mBaseFrames.
                super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)local_4c8.mAnimatedBones.
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4c8.mAnimatedBones.
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xfc0fc0fc0fc0fc1 != 0)))) {
      pLVar17 = DefaultLogger::get();
      Logger::error(pLVar17,"MD5ANIM: No frames or animated bones loaded");
    }
    else {
      this->bHadMD5Anim = true;
      this->pScene->mNumAnimations = 1;
      ppaVar11 = (aiAnimation **)operator_new__(8);
      this->pScene->mAnimations = ppaVar11;
      paVar12 = (aiAnimation *)operator_new(0x448);
      (paVar12->mName).length = 0;
      (paVar12->mName).data[0] = '\0';
      memset((paVar12->mName).data + 1,0x1b,0x3ff);
      paVar12->mDuration = -1.0;
      paVar12->mTicksPerSecond = 0.0;
      paVar12->mNumChannels = 0;
      paVar12->mChannels = (aiNodeAnim **)0x0;
      paVar12->mNumMeshChannels = 0;
      paVar12->mMeshChannels = (aiMeshAnim **)0x0;
      paVar12->mNumMorphMeshChannels = 0;
      paVar12->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *this->pScene->mAnimations = paVar12;
      uVar34 = ((long)local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0xfc0fc0fc0fc0fc1;
      uVar33 = (uint)uVar34;
      paVar12->mNumChannels = uVar33;
      ppaVar13 = (aiNodeAnim **)operator_new__((uVar34 & 0xffffffff) << 3);
      paVar12->mChannels = ppaVar13;
      local_500 = paVar12;
      local_470 = this;
      if (uVar33 == 0) {
        local_4f0 = local_4c8.mFrames.
                    super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pFVar31 = local_4c8.mFrames.
                  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_4f8 = (aiVectorKey *)0x0;
        do {
          paVar14 = (aiNodeAnim *)operator_new(0x438);
          (paVar14->mNodeName).length = 0;
          (paVar14->mNodeName).data[0] = '\0';
          memset((paVar14->mNodeName).data + 1,0x1b,0x3ff);
          paVar14->mRotationKeys = (aiQuatKey *)0x0;
          paVar14->mNumScalingKeys = 0;
          *(undefined8 *)&paVar14->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar14->mPositionKeys + 4) = 0;
          paVar14->mScalingKeys = (aiVectorKey *)0x0;
          paVar14->mPreState = aiAnimBehaviour_DEFAULT;
          paVar14->mPostState = aiAnimBehaviour_DEFAULT;
          paVar12->mChannels[(long)local_4f8] = paVar14;
          uVar33 = local_4c8.mAnimatedBones.
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)local_4f8].
                   super_BaseJointDescription.mName.length;
          if (0x3fe < uVar33) {
            uVar33 = 0x3ff;
          }
          __n = (ulong)uVar33;
          local_438[0].mVertices.
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_438[0].mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar33);
          __dest = (void *)((long)&local_438[0].mVertices.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4);
          memcpy(__dest,local_4c8.mAnimatedBones.
                        super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_4f8].
                        super_BaseJointDescription.mName.data,__n);
          *(undefined1 *)
           ((long)&local_438[0].mVertices.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + __n + 4) = 0;
          (paVar14->mNodeName).length = uVar33;
          memcpy((paVar14->mNodeName).data,__dest,__n);
          pFVar9 = local_4c8.mFrames.
                   super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pFVar31 = local_4c8.mFrames.
                    super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar12 = local_500;
          uVar24 = (long)local_4c8.mFrames.
                         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_4c8.mFrames.
                         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar24;
          uVar34 = SUB168(auVar7 * ZEXT816(0x18),0);
          (paVar14->mNodeName).data[__n] = '\0';
          if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          paVar15 = (aiVectorKey *)operator_new__(uVar34);
          local_4f0 = pFVar9;
          if (pFVar9 != pFVar31) {
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar15->mTime + lVar22);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar15->mValue).z + lVar22) = 0;
              lVar22 = lVar22 + 0x18;
            } while (uVar24 * 0x18 != lVar22);
          }
          paVar14->mPositionKeys = paVar15;
          paVar16 = (aiQuatKey *)operator_new__(uVar34);
          if (local_4f0 != pFVar31) {
            paVar23 = paVar16;
            do {
              paVar23->mTime = 0.0;
              (paVar23->mValue).w = 1.0;
              (paVar23->mValue).x = 0.0;
              (paVar23->mValue).y = 0.0;
              (paVar23->mValue).z = 0.0;
              paVar23 = paVar23 + 1;
            } while (paVar23 != paVar16 + uVar24);
          }
          paVar14->mRotationKeys = paVar16;
          local_4f8 = (aiVectorKey *)((long)&local_4f8->mTime + 1);
        } while (local_4f8 < (aiVectorKey *)(ulong)paVar12->mNumChannels);
      }
      paVar12->mTicksPerSecond = (double)local_4c8.fFrameRate;
      if (pFVar31 != local_4f0) {
        do {
          dVar39 = (double)pFVar31->iIndex;
          if ((((pFVar31->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pFVar31->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) ||
              (pFVar31 ==
               local_4c8.mFrames.
               super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
               _M_impl.super__Vector_impl_data._M_start)) &&
             (local_4c8.mAnimatedBones.
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_4c8.mAnimatedBones.
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            ppaVar13 = local_500->mChannels;
            pAVar19 = local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pBVar25 = local_4c8.mBaseFrames.
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar32 = local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_468 = dVar39;
            do {
              pfVar6 = (pFVar31->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)pAVar32->iFirstKeyIndex <
                  (ulong)((long)(pFVar31->mValues).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar6 >> 2)) {
                pfVar18 = pfVar6 + pAVar32->iFirstKeyIndex;
                paVar14 = *ppaVar13;
                paVar15 = paVar14->mPositionKeys;
                uVar33 = paVar14->mNumPositionKeys;
                paVar14->mNumPositionKeys = uVar33 + 1;
                local_4f8 = paVar15 + uVar33;
                paVar16 = paVar14->mRotationKeys;
                uVar3 = paVar14->mNumRotationKeys;
                paVar14->mNumRotationKeys = uVar3 + 1;
                uVar21 = 0;
                local_438[0].mVertices.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)local_438[0].mVertices.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000
                              );
                local_504 = 0.0;
                local_508 = 0.0;
                pfVar26 = &paVar15[uVar33].mValue.y;
                pfVar27 = &paVar15[uVar33].mValue.z;
                do {
                  if ((pAVar32->iFlags >> (uVar21 & 0x1f) & 1) == 0) {
                    pBVar30 = (pointer)&(pBVar25->vPositionXYZ).z;
                    paVar29 = (aiVector3D *)pfVar27;
                    if ((uVar21 != 2) &&
                       (pBVar30 = pBVar25, paVar29 = &paVar15[uVar33].mValue, uVar21 == 1)) {
                      pBVar30 = (pointer)&(pBVar25->vPositionXYZ).y;
                      paVar29 = (aiVector3D *)pfVar26;
                    }
                    paVar29->x = (pBVar30->vPositionXYZ).x;
                  }
                  else {
                    paVar29 = (aiVector3D *)pfVar27;
                    if ((uVar21 != 2) && (paVar29 = &paVar15[uVar33].mValue, uVar21 == 1)) {
                      paVar29 = (aiVector3D *)pfVar26;
                    }
                    fVar35 = *pfVar18;
                    pfVar18 = pfVar18 + 1;
                    paVar29->x = fVar35;
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != 3);
                uVar33 = pAVar32->iFlags;
                iVar10 = 0;
                do {
                  if ((uVar33 >> ((byte)iVar10 & 0x1f) & 8) == 0) {
                    if (iVar10 == 2) {
                      pSVar28 = (SkeletonMeshBuilder *)&local_508;
                      paVar29 = (aiVector3D *)&(pBVar25->vRotationQuat).z;
                    }
                    else {
                      pSVar28 = local_438;
                      paVar29 = &pBVar25->vRotationQuat;
                      if (iVar10 == 1) {
                        pSVar28 = (SkeletonMeshBuilder *)&local_504;
                        paVar29 = (aiVector3D *)&(pBVar25->vRotationQuat).y;
                      }
                    }
                    *(float *)&(pSVar28->mVertices).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data = paVar29->x;
                  }
                  else {
                    if (iVar10 == 2) {
                      pSVar28 = (SkeletonMeshBuilder *)&local_508;
                    }
                    else {
                      pSVar28 = local_438;
                      if (iVar10 == 1) {
                        pSVar28 = (SkeletonMeshBuilder *)&local_504;
                      }
                    }
                    fVar35 = *pfVar18;
                    pfVar18 = pfVar18 + 1;
                    *(float *)&(pSVar28->mVertices).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data = fVar35;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 3);
                paVar16[uVar3].mValue.x =
                     local_438[0].mVertices.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_;
                paVar16[uVar3].mValue.y = local_504;
                paVar16[uVar3].mValue.z = local_508;
                fVar35 = ((1.0 - local_438[0].mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_4_ *
                                 local_438[0].mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) -
                         local_504 * local_504) - local_508 * local_508;
                fVar38 = 0.0;
                if (0.0 <= fVar35) {
                  if (fVar35 < 0.0) {
                    fVar38 = sqrtf(fVar35);
                    dVar39 = local_468;
                  }
                  else {
                    fVar38 = SQRT(fVar35);
                  }
                }
                paVar16[uVar3].mValue.w = -fVar38;
                local_4f8->mTime = dVar39;
                paVar16[uVar3].mTime = dVar39;
                pAVar19 = local_4c8.mAnimatedBones.
                          super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else if (pAVar32->iFlags != 0) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_438[0].mVertices.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&local_438[0].mVertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_438,"MD5: Keyframe index is out of range","");
                std::runtime_error::runtime_error(this_01,(string *)local_438);
                *(undefined ***)this_01 = &PTR__runtime_error_008dc448;
                __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              pAVar32 = pAVar32 + 1;
              ppaVar13 = ppaVar13 + 1;
              pBVar25 = pBVar25 + 1;
            } while (pAVar32 != pAVar19);
          }
          dVar2 = local_500->mDuration;
          uVar36 = SUB84(dVar2,0);
          uVar37 = (undefined4)((ulong)dVar2 >> 0x20);
          if (dVar2 <= dVar39) {
            uVar36 = SUB84(dVar39,0);
            uVar37 = (undefined4)((ulong)dVar39 >> 0x20);
          }
          local_500->mDuration = (double)CONCAT44(uVar37,uVar36);
          pFVar31 = pFVar31 + 1;
        } while (pFVar31 != local_4f0);
      }
      this_00 = local_470;
      if (local_470->pScene->mRootNode == (aiNode *)0x0) {
        paVar20 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar20);
        this_00->pScene->mRootNode = paVar20;
        paVar20 = this_00->pScene->mRootNode;
        (paVar20->mName).length = 0xf;
        builtin_strncpy((paVar20->mName).data,"<MD5_Hierarchy>",0x10);
        AttachChilds_Anim(this_00,-1,this_00->pScene->mRootNode,&local_4c8.mAnimatedBones,
                          local_500->mChannels);
        paVar20 = this_00->pScene->mRootNode;
        if (paVar20->mNumChildren != 0) {
          SkeletonMeshBuilder::SkeletonMeshBuilder
                    (local_438,this_00->pScene,*paVar20->mChildren,false);
          SkeletonMeshBuilder::~SkeletonMeshBuilder(local_438);
        }
      }
    }
    std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::~vector
              (&local_4c8.mFrames);
    if (local_4c8.mBaseFrames.
        super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.mBaseFrames.
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4c8.mAnimatedBones.
        super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&local_460.mSections);
  }
  if (file != (IOStream *)0x0) {
    (*file->_vptr_IOStream[1])(file);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MD5Importer::LoadMD5AnimFile ()
{
    std::string pFile = mFile + "md5anim";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        ASSIMP_LOG_WARN("Failed to read MD5ANIM file: " + pFile);
        return;
    }
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the animation information from the parse tree
    MD5::MD5AnimParser animParser(parser.mSections);

    // generate and fill the output animation
    if (animParser.mAnimatedBones.empty() || animParser.mFrames.empty() ||
        animParser.mBaseFrames.size() != animParser.mAnimatedBones.size())  {
        ASSIMP_LOG_ERROR("MD5ANIM: No frames or animated bones loaded");
    }
    else {
        bHadMD5Anim = true;

        pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations = 1];
        aiAnimation* anim = pScene->mAnimations[0] = new aiAnimation();
        anim->mNumChannels = (unsigned int)animParser.mAnimatedBones.size();
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
        for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
            aiNodeAnim* node = anim->mChannels[i] = new aiNodeAnim();
            node->mNodeName = aiString( animParser.mAnimatedBones[i].mName );

            // allocate storage for the keyframes
            node->mPositionKeys = new aiVectorKey[animParser.mFrames.size()];
            node->mRotationKeys = new aiQuatKey[animParser.mFrames.size()];
        }

        // 1 tick == 1 frame
        anim->mTicksPerSecond = animParser.fFrameRate;

        for (FrameList::const_iterator iter = animParser.mFrames.begin(), iterEnd = animParser.mFrames.end();iter != iterEnd;++iter){
            double dTime = (double)(*iter).iIndex;
            aiNodeAnim** pcAnimNode = anim->mChannels;
            if (!(*iter).mValues.empty() || iter == animParser.mFrames.begin()) /* be sure we have at least one frame */
            {
                // now process all values in there ... read all joints
                MD5::BaseFrameDesc* pcBaseFrame = &animParser.mBaseFrames[0];
                for (AnimBoneList::const_iterator iter2 = animParser.mAnimatedBones.begin(); iter2 != animParser.mAnimatedBones.end();++iter2,
                    ++pcAnimNode,++pcBaseFrame)
                {
                    if((*iter2).iFirstKeyIndex >= (*iter).mValues.size()) {

                        // Allow for empty frames
                        if ((*iter2).iFlags != 0) {
                            throw DeadlyImportError("MD5: Keyframe index is out of range");

                        }
                        continue;
                    }
                    const float* fpCur = &(*iter).mValues[(*iter2).iFirstKeyIndex];
                    aiNodeAnim* pcCurAnimBone = *pcAnimNode;

                    aiVectorKey* vKey = &pcCurAnimBone->mPositionKeys[pcCurAnimBone->mNumPositionKeys++];
                    aiQuatKey* qKey = &pcCurAnimBone->mRotationKeys  [pcCurAnimBone->mNumRotationKeys++];
                    aiVector3D vTemp;

                    // translational component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (1u << i)) {
                            vKey->mValue[i] =  *fpCur++;
                        }
                        else vKey->mValue[i] = pcBaseFrame->vPositionXYZ[i];
                    }

                    // orientation component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (8u << i)) {
                            vTemp[i] =  *fpCur++;
                        }
                        else vTemp[i] = pcBaseFrame->vRotationQuat[i];
                    }

                    MD5::ConvertQuaternion(vTemp, qKey->mValue);
                    qKey->mTime = vKey->mTime = dTime;
                }
            }

            // compute the duration of the animation
            anim->mDuration = std::max(dTime,anim->mDuration);
        }

        // If we didn't build the hierarchy yet (== we didn't load a MD5MESH),
        // construct it now from the data given in the MD5ANIM.
        if (!pScene->mRootNode) {
            pScene->mRootNode = new aiNode();
            pScene->mRootNode->mName.Set("<MD5_Hierarchy>");

            AttachChilds_Anim(-1,pScene->mRootNode,animParser.mAnimatedBones,(const aiNodeAnim**)anim->mChannels);

            // Call SkeletonMeshBuilder to construct a mesh to represent the shape
            if (pScene->mRootNode->mNumChildren) {
                SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[0]);
            }
        }
    }
}